

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

upb_MiniTable *
upb_MtDecoder_BuildMiniTableWithBuf
          (upb_MtDecoder *decoder,char *data,size_t len,void **buf,size_t *buf_size)

{
  uint8_t *puVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  undefined2 uVar5;
  upb_MiniTablePlatform uVar6;
  upb_MiniTableField *puVar7;
  size_t __nmemb;
  int iVar8;
  upb_MiniTable *puVar9;
  ulong uVar10;
  upb_LayoutItem *puVar11;
  upb_LayoutItem *puVar12;
  byte *pbVar13;
  upb_LayoutItem *puVar14;
  ulong uVar15;
  char *pcVar16;
  upb_LayoutItem *puVar17;
  uint16_t uVar18;
  size_t sVar19;
  long lVar20;
  byte *pbVar21;
  bool bVar22;
  upb_LayoutItem item;
  
  iVar8 = _setjmp((__jmp_buf_tag *)(decoder->base).err);
  if (iVar8 == 0) {
    puVar9 = decoder->table;
    if (puVar9 == (upb_MiniTable *)0x0) {
      pcVar16 = "Out of memory";
LAB_0012ca9f:
      upb_MdDecoder_ErrorJmp(&decoder->base,pcVar16);
    }
    puVar9->size_dont_copy_me__upb_internal_use_only = 8;
    puVar9->field_count_dont_copy_me__upb_internal_use_only = 0;
    puVar9->ext_dont_copy_me__upb_internal_use_only = '\0';
    puVar9->dense_below_dont_copy_me__upb_internal_use_only = '\0';
    puVar9->table_mask_dont_copy_me__upb_internal_use_only = 0xff;
    puVar9->required_count_dont_copy_me__upb_internal_use_only = '\0';
    sVar19 = len - 1;
    if (len != 0) {
      cVar2 = *data;
      if (cVar2 == '$') {
        upb_MtDecoder_ParseMessage(decoder,data + 1,sVar19);
        upb_MtDecoder_AssignHasbits(decoder);
        uVar15 = (ulong)decoder->table->field_count_dont_copy_me__upb_internal_use_only;
        if (uVar15 != 0) {
          lVar20 = 0xb;
          uVar10 = 0;
          do {
            if (*(ushort *)((long)decoder->fields + lVar20 + -7) < 3) {
              item._0_8_ = ((ulong)(*(byte *)((long)&decoder->fields->
                                                     number_dont_copy_me__upb_internal_use_only +
                                             lVar20) >> 6) << 0x20) + uVar10;
              item.type = kUpb_LayoutItemType_Field;
              upb_MtDecoder_PushItem(decoder,item);
            }
            uVar10 = uVar10 + 1;
            lVar20 = lVar20 + 0xc;
          } while (uVar15 != uVar10);
        }
        __nmemb = (decoder->vec).size;
        if (__nmemb != 0) {
          qsort((decoder->vec).data,__nmemb,0xc,upb_MtDecoder_CompareFields);
          sVar19 = (decoder->vec).size;
          if ((sVar19 != 0) && (0 < (long)sVar19)) {
            puVar14 = (decoder->vec).data;
            puVar17 = puVar14 + sVar19;
            uVar6 = decoder->platform;
            puVar9 = decoder->table;
            uVar15 = (ulong)puVar9->size_dont_copy_me__upb_internal_use_only;
            puVar12 = puVar14;
            do {
              uVar10 = (ulong)puVar12->rep;
              bVar22 = uVar6 == kUpb_MiniTablePlatform_32Bit;
              pbVar21 = &upb_MtDecoder_SizeOfRep_kRepToSize64 + uVar10;
              if (bVar22) {
                pbVar21 = &upb_MtDecoder_AlignOfRep_kRepToAlign64 + uVar10;
              }
              pbVar13 = (byte *)((long)&upb_MtDecoder_AlignOfRep_kRepToAlign32 + uVar10);
              if (!bVar22) {
                pbVar13 = &upb_MtDecoder_AlignOfRep_kRepToAlign64 + uVar10;
              }
              uVar15 = ((ulong)*pbVar13 + (uVar15 & 0xffff)) - 1;
              lVar20 = uVar15 - uVar15 % (ulong)*pbVar13;
              uVar15 = (ulong)*pbVar21 + lVar20;
              if (0xffff < uVar15) {
                upb_MdDecoder_ErrorJmp
                          (&decoder->base,"Message size exceeded maximum size of %zu bytes",0xffff);
              }
              puVar9->size_dont_copy_me__upb_internal_use_only = (uint16_t)uVar15;
              puVar12->offset = (uint16_t)lVar20;
              puVar12 = puVar12 + 1;
              puVar11 = puVar14;
            } while (puVar12 < puVar17);
            do {
              if (puVar11->type == kUpb_LayoutItemType_OneofCase) {
                puVar7 = decoder->fields;
                uVar3 = puVar11->field_index;
                uVar4 = puVar11->offset;
                puVar7[uVar3].presence = ~uVar4;
                uVar18 = puVar7[uVar3].offset_dont_copy_me__upb_internal_use_only;
                if (uVar18 != 0xffff) {
                  uVar3 = puVar9->field_count_dont_copy_me__upb_internal_use_only;
                  do {
                    iVar8 = uVar18 - 3;
                    if ((int)(uint)uVar3 <= iVar8) {
                      __assert_fail("f->offset_dont_copy_me__upb_internal_use_only - kOneofBase < d->table->field_count_dont_copy_me__upb_internal_use_only"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/mini_descriptor/decode.c"
                                    ,0x270,"void upb_MtDecoder_AssignOffsets(upb_MtDecoder *)");
                    }
                    puVar7[iVar8].presence = ~uVar4;
                    uVar18 = puVar7[iVar8].offset_dont_copy_me__upb_internal_use_only;
                  } while (uVar18 != 0xffff);
                }
              }
              puVar11 = puVar11 + 1;
            } while (puVar11 < puVar17);
            puVar7 = decoder->fields;
            do {
              uVar3 = puVar14->field_index;
              if (puVar14->type == kUpb_LayoutItemType_Field) {
                puVar7[uVar3].offset_dont_copy_me__upb_internal_use_only = puVar14->offset;
              }
              else if (puVar14->type == kUpb_LayoutItemType_OneofField) {
                uVar18 = puVar14->offset;
                uVar4 = puVar7[uVar3].offset_dont_copy_me__upb_internal_use_only;
                puVar7[uVar3].offset_dont_copy_me__upb_internal_use_only = uVar18;
                while (uVar4 != 0xffff) {
                  uVar3 = puVar7[(ulong)uVar4 - 3].offset_dont_copy_me__upb_internal_use_only;
                  puVar7[(ulong)uVar4 - 3].offset_dont_copy_me__upb_internal_use_only = uVar18;
                  uVar4 = uVar3;
                }
              }
              puVar14 = puVar14 + 1;
            } while (puVar14 < puVar17);
          }
        }
        uVar5 = decoder->table->size_dont_copy_me__upb_internal_use_only;
        decoder->table->size_dont_copy_me__upb_internal_use_only = uVar5 + 7 & 0xfff8;
      }
      else if (cVar2 == '&') {
        if (sVar19 != 0) {
          upb_MdDecoder_ErrorJmp(&decoder->base,"Invalid message set encode length: %zu",sVar19);
        }
        puVar9->ext_dont_copy_me__upb_internal_use_only = '\x02';
        puVar9->dense_below_dont_copy_me__upb_internal_use_only = '\0';
        puVar9->table_mask_dont_copy_me__upb_internal_use_only = 0xff;
        puVar9->required_count_dont_copy_me__upb_internal_use_only = '\0';
      }
      else {
        if (cVar2 != '%') {
          uVar15 = (ulong)(uint)(int)cVar2;
          pcVar16 = "Invalid message version: %c";
LAB_0012ca50:
          upb_MdDecoder_ErrorJmp(&decoder->base,pcVar16,uVar15);
        }
        upb_MtDecoder_ParseMessage(decoder,data + 1,sVar19);
        upb_MtDecoder_AssignHasbits(decoder);
        uVar3 = decoder->table->field_count_dont_copy_me__upb_internal_use_only;
        uVar15 = (ulong)uVar3;
        if (uVar3 != 2) {
          pcVar16 = "%hu fields in map";
          goto LAB_0012ca50;
        }
        sVar19 = (decoder->vec).size;
        if ((sVar19 != 0) && (0 < (long)sVar19)) {
          puVar12 = (decoder->vec).data;
          puVar14 = puVar12 + sVar19;
          do {
            if (puVar12->type == kUpb_LayoutItemType_OneofCase) {
              pcVar16 = "Map entry cannot have oneof";
              goto LAB_0012ca9f;
            }
            puVar12 = puVar12 + 1;
          } while (puVar12 < puVar14);
        }
        upb_MtDecoder_ValidateEntryField
                  (decoder,decoder->table->fields_dont_copy_me__upb_internal_use_only,1);
        upb_MtDecoder_ValidateEntryField
                  (decoder,decoder->table->fields_dont_copy_me__upb_internal_use_only + 1,2);
        puVar7 = decoder->fields;
        puVar7->offset_dont_copy_me__upb_internal_use_only = 0x10;
        puVar7[1].offset_dont_copy_me__upb_internal_use_only = 0x20;
        puVar9 = decoder->table;
        puVar9->size_dont_copy_me__upb_internal_use_only = 0x30;
        puVar1 = &puVar9->ext_dont_copy_me__upb_internal_use_only;
        *puVar1 = *puVar1 | 4;
      }
    }
    *buf = (decoder->vec).data;
    *buf_size = (decoder->vec).capacity * 0xc;
    puVar9 = decoder->table;
  }
  else {
    *buf = (decoder->vec).data;
    *buf_size = (decoder->vec).capacity * 0xc;
    puVar9 = (upb_MiniTable *)0x0;
  }
  return puVar9;
}

Assistant:

static upb_MiniTable* upb_MtDecoder_BuildMiniTableWithBuf(
    upb_MtDecoder* const decoder, const char* const data, const size_t len,
    void** const buf, size_t* const buf_size) {
  if (UPB_SETJMP(decoder->base.err) != 0) {
    *buf = decoder->vec.data;
    *buf_size = decoder->vec.capacity * sizeof(*decoder->vec.data);
    return NULL;
  }

  return upb_MtDecoder_DoBuildMiniTableWithBuf(decoder, data, len, buf,
                                               buf_size);
}